

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsntopologybasedenergy.cpp
# Opt level: O0

void __thiscall WSNTopologyBasedEnergy::TopLayer1SentSink(WSNTopologyBasedEnergy *this)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  reference piVar4;
  double dVar5;
  _InputArray local_728;
  allocator<char> local_709;
  string local_708 [32];
  Scalar local_6e8;
  WSNNode local_6c8;
  int local_68c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Stack_688;
  int i_1;
  _InputArray local_680;
  allocator<char> local_661;
  string local_660 [32];
  Scalar local_640;
  WSNNode local_620;
  WSNNode local_5e8;
  WSNNode local_5b0;
  WSNNode local_578;
  WSNNode local_540;
  WSNNode local_508;
  WSNNode local_4d0;
  WSNNode local_498;
  WSNNode local_460;
  WSNNode local_428;
  WSNNode local_3f0;
  WSNNode local_3b8;
  WSNNode local_380;
  WSNNode local_348;
  WSNNode local_310;
  WSNNode local_2d8;
  WSNNode local_2a0;
  WSNNode local_268;
  WSNNode local_230;
  WSNNode local_1f8;
  WSNNode local_1c0;
  _InputArray local_188;
  allocator<char> local_169;
  string local_168 [32];
  Scalar_<double> local_148;
  Point_<int> local_128;
  Point_<int> local_120;
  _InputOutputArray local_118;
  int local_fc;
  undefined1 local_f8 [4];
  int i;
  Point_<int> local_d8;
  Point_<int> local_d0;
  _InputOutputArray local_c8;
  Mat local_a0 [8];
  Mat tempimg;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  int *local_38;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> _array;
  iterator it;
  WSNTopologyBasedEnergy *this_local;
  
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::__normal_iterator
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  SelectServalNode((vector<int,_std::allocator<int>_> *)local_30,this);
  local_38 = (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)local_30);
  _array.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_38;
  while( true ) {
    local_40._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_30);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,&local_40);
    if (!bVar2) break;
    cv::Mat::clone();
    SelectLeaderID(this);
    cv::_InputOutputArray::_InputOutputArray(&local_c8,local_a0);
    cv::Point_<int>::Point_(&local_d0,0,0);
    cv::Point_<int>::Point_(&local_d8,this->LayerLeaderNode[1].x,this->LayerLeaderNode[1].y);
    cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_f8,45.0,150.0,45.0,0.0);
    cv::line(&local_c8,&local_d0,&local_d8,local_f8,1,8,0);
    cv::_InputOutputArray::~_InputOutputArray(&local_c8);
    for (local_fc = 0; local_fc < 4; local_fc = local_fc + 1) {
      cv::_InputOutputArray::_InputOutputArray(&local_118,local_a0);
      cv::Point_<int>::Point_
                (&local_120,this->LayerLeaderNode[local_fc].x,this->LayerLeaderNode[local_fc].y);
      cv::Point_<int>::Point_
                (&local_128,this->LayerLeaderNode[local_fc + 1].x,
                 this->LayerLeaderNode[local_fc + 1].y);
      cv::Scalar_<double>::Scalar_(&local_148,0.0,255.0,0.0,0.0);
      cv::line(&local_118,&local_120,&local_128,&local_148,1,8,0);
      cv::_InputOutputArray::~_InputOutputArray(&local_118);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_168,"WSN",&local_169);
      cv::_InputArray::_InputArray(&local_188,local_a0);
      cv::imshow(local_168,&local_188);
      cv::_InputArray::~_InputArray(&local_188);
      std::__cxx11::string::~string(local_168);
      std::allocator<char>::~allocator(&local_169);
    }
    if ((this->Test & 1U) == 1) {
      cv::waitKey(100);
    }
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    iVar3 = WSNNode::layer(this->node + *piVar4);
    if (iVar3 == 0) {
      dVar1 = this->alpha;
      WSNNode::WSNNode(&local_1c0,this->LayerLeaderNode);
      WSNNode::WSNNode(&local_1f8,this->LayerLeaderNode + 1);
      dVar5 = SDistanceBetweenNodes(this,&local_1c0,&local_1f8);
      iVar3 = WSNNode::GetNodeID(this->LayerLeaderNode);
      this->node[iVar3].energy = this->node[iVar3].energy - (dVar1 * dVar5 + 1.0);
      WSNNode::~WSNNode(&local_1f8);
      WSNNode::~WSNNode(&local_1c0);
      dVar1 = this->alpha;
      piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      WSNNode::WSNNode(&local_230,this->node + *piVar4);
      WSNNode::WSNNode(&local_268,this->LayerLeaderNode);
      dVar5 = SDistanceBetweenNodes(this,&local_230,&local_268);
      piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      this->node[*piVar4].energy = this->node[*piVar4].energy - (dVar1 * dVar5 + 0.5);
      WSNNode::~WSNNode(&local_268);
      WSNNode::~WSNNode(&local_230);
      iVar3 = WSNNode::GetNodeID(this->LayerLeaderNode + 1);
      this->node[iVar3].energy = this->node[iVar3].energy - 1.0;
    }
    else {
      piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      iVar3 = WSNNode::layer(this->node + *piVar4);
      if (iVar3 == 1) {
        dVar1 = this->alpha;
        WSNNode::WSNNode(&local_2a0,this->LayerLeaderNode + 1);
        WSNNode::WSNNode(&local_2d8,&this->sink);
        dVar5 = SDistanceBetweenNodes(this,&local_2a0,&local_2d8);
        iVar3 = WSNNode::GetNodeID(this->LayerLeaderNode + 1);
        this->node[iVar3].energy = this->node[iVar3].energy - (dVar1 * dVar5 + 1.0);
        WSNNode::~WSNNode(&local_2d8);
        WSNNode::~WSNNode(&local_2a0);
        dVar1 = this->alpha;
        piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        WSNNode::WSNNode(&local_310,this->node + *piVar4);
        WSNNode::WSNNode(&local_348,this->LayerLeaderNode + 1);
        dVar5 = SDistanceBetweenNodes(this,&local_310,&local_348);
        piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        this->node[*piVar4].energy = this->node[*piVar4].energy - (dVar1 * dVar5 + 0.5);
        WSNNode::~WSNNode(&local_348);
        WSNNode::~WSNNode(&local_310);
      }
      else {
        piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        iVar3 = WSNNode::layer(this->node + *piVar4);
        if (iVar3 == 2) {
          dVar1 = this->alpha;
          WSNNode::WSNNode(&local_380,this->LayerLeaderNode + 2);
          WSNNode::WSNNode(&local_3b8,this->LayerLeaderNode + 1);
          dVar5 = SDistanceBetweenNodes(this,&local_380,&local_3b8);
          iVar3 = WSNNode::GetNodeID(this->LayerLeaderNode + 2);
          this->node[iVar3].energy = this->node[iVar3].energy - (dVar1 * dVar5 + 1.0);
          WSNNode::~WSNNode(&local_3b8);
          WSNNode::~WSNNode(&local_380);
          dVar1 = this->alpha;
          piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
          WSNNode::WSNNode(&local_3f0,this->node + *piVar4);
          WSNNode::WSNNode(&local_428,this->LayerLeaderNode + 2);
          dVar5 = SDistanceBetweenNodes(this,&local_3f0,&local_428);
          piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
          this->node[*piVar4].energy = this->node[*piVar4].energy - (dVar1 * dVar5 + 0.5);
          WSNNode::~WSNNode(&local_428);
          WSNNode::~WSNNode(&local_3f0);
          iVar3 = WSNNode::GetNodeID(this->LayerLeaderNode + 1);
          this->node[iVar3].energy = this->node[iVar3].energy - 1.0;
        }
        else {
          piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
          iVar3 = WSNNode::layer(this->node + *piVar4);
          if (iVar3 == 3) {
            dVar1 = this->alpha;
            WSNNode::WSNNode(&local_460,this->LayerLeaderNode + 3);
            WSNNode::WSNNode(&local_498,this->LayerLeaderNode + 2);
            dVar5 = SDistanceBetweenNodes(this,&local_460,&local_498);
            iVar3 = WSNNode::GetNodeID(this->LayerLeaderNode + 3);
            this->node[iVar3].energy = this->node[iVar3].energy - (dVar1 * dVar5 + 1.0);
            WSNNode::~WSNNode(&local_498);
            WSNNode::~WSNNode(&local_460);
            dVar1 = this->alpha;
            piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
            WSNNode::WSNNode(&local_4d0,this->node + *piVar4);
            WSNNode::WSNNode(&local_508,this->LayerLeaderNode + 3);
            dVar5 = SDistanceBetweenNodes(this,&local_4d0,&local_508);
            piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
            this->node[*piVar4].energy = this->node[*piVar4].energy - (dVar1 * dVar5 + 0.5);
            WSNNode::~WSNNode(&local_508);
            WSNNode::~WSNNode(&local_4d0);
            iVar3 = WSNNode::GetNodeID(this->LayerLeaderNode + 1);
            this->node[iVar3].energy = this->node[iVar3].energy + -1.0;
            iVar3 = WSNNode::GetNodeID(this->LayerLeaderNode + 2);
            this->node[iVar3].energy = this->node[iVar3].energy - 1.0;
          }
          else {
            dVar1 = this->alpha;
            WSNNode::WSNNode(&local_540,this->LayerLeaderNode + 4);
            WSNNode::WSNNode(&local_578,this->LayerLeaderNode + 3);
            dVar5 = SDistanceBetweenNodes(this,&local_540,&local_578);
            iVar3 = WSNNode::GetNodeID(this->LayerLeaderNode + 4);
            this->node[iVar3].energy = this->node[iVar3].energy - (dVar1 * dVar5 + 1.0);
            WSNNode::~WSNNode(&local_578);
            WSNNode::~WSNNode(&local_540);
            dVar1 = this->alpha;
            piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
            WSNNode::WSNNode(&local_5b0,this->node + *piVar4);
            WSNNode::WSNNode(&local_5e8,this->LayerLeaderNode + 4);
            dVar5 = SDistanceBetweenNodes(this,&local_5b0,&local_5e8);
            piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
            this->node[*piVar4].energy = this->node[*piVar4].energy - (dVar1 * dVar5 + 0.5);
            WSNNode::~WSNNode(&local_5e8);
            WSNNode::~WSNNode(&local_5b0);
            iVar3 = WSNNode::GetNodeID(this->LayerLeaderNode + 1);
            this->node[iVar3].energy = this->node[iVar3].energy + -1.0;
            iVar3 = WSNNode::GetNodeID(this->LayerLeaderNode + 2);
            this->node[iVar3].energy = this->node[iVar3].energy + -1.0;
            iVar3 = WSNNode::GetNodeID(this->LayerLeaderNode + 3);
            this->node[iVar3].energy = this->node[iVar3].energy - 1.0;
          }
        }
      }
    }
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    WSNNode::WSNNode(&local_620,this->node + *piVar4);
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    WSNNode::NodeColor(&local_640,this->node + *piVar4);
    drawCrossNode(this,&this->img,&local_620,&local_640);
    WSNNode::~WSNNode(&local_620);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_660,"WSN",&local_661);
    cv::_InputArray::_InputArray(&local_680,&this->img);
    cv::imshow(local_660,&local_680);
    cv::_InputArray::~_InputArray(&local_680);
    std::__cxx11::string::~string(local_660);
    std::allocator<char>::~allocator(&local_661);
    cv::Mat::~Mat(local_a0);
    _Stack_688 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator++((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,0);
  }
  for (local_68c = 0; local_68c < 100; local_68c = local_68c + 1) {
    WSNNode::WSNNode(&local_6c8,this->node + local_68c);
    WSNNode::NodeColor(&local_6e8,this->node + local_68c);
    drawCrossNode(this,&this->img,&local_6c8,&local_6e8);
    WSNNode::~WSNNode(&local_6c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_708,"WSN",&local_709);
    cv::_InputArray::_InputArray(&local_728,&this->img);
    cv::imshow(local_708,&local_728);
    cv::_InputArray::~_InputArray(&local_728);
    std::__cxx11::string::~string(local_708);
    std::allocator<char>::~allocator(&local_709);
  }
  if ((this->Test & 1U) == 1) {
    cv::waitKey(400);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  return;
}

Assistant:

void WSNTopologyBasedEnergy::TopLayer1SentSink()
{
	vector<int>::iterator it;
	vector<int> _array=SelectServalNode();
	for(it=_array.begin();it!=_array.end();it++)
	{
		Mat tempimg=img.clone();

		//选择每层的leader节点
		SelectLeaderID();


		// 链接所有leader节点
		line(tempimg,Point(0,0),Point(LayerLeaderNode[1].x,LayerLeaderNode[1].y),Scalar(45,150,45),1,8,0);//用黑绿色直线连接sink节点和顶层节点
		for(int i=0;i<LayerNum-1;i++)
		{
			line(tempimg,Point(LayerLeaderNode[i].x,LayerLeaderNode[i].y),Point(LayerLeaderNode[i+1].x,LayerLeaderNode[i+1].y),Scalar(0,255,0));
			imshow("WSN",tempimg);
		}
		if(true==Test) waitKey(100);


		//计算能量变化值
		if(0==node[*it].layer())
		{
			node[LayerLeaderNode[0].GetNodeID()].energy-=1+alpha * SDistanceBetweenNodes(LayerLeaderNode[0],LayerLeaderNode[1]);
			node[*it].energy-=0.5+alpha * SDistanceBetweenNodes(node[*it],LayerLeaderNode[0]);
			node[LayerLeaderNode[1].GetNodeID()].energy-=1;
		}
		else if(1==node[*it].layer())
		{
			node[LayerLeaderNode[1].GetNodeID()].energy-=1+alpha * SDistanceBetweenNodes(LayerLeaderNode[1],sink);
			node[*it].energy-=0.5+alpha * SDistanceBetweenNodes(node[*it],LayerLeaderNode[1]);
		}
		else if(2==node[*it].layer())
		{
			node[LayerLeaderNode[2].GetNodeID()].energy-=1+alpha * SDistanceBetweenNodes(LayerLeaderNode[2],LayerLeaderNode[1]);
			node[*it].energy-=0.5+alpha * SDistanceBetweenNodes(node[*it],LayerLeaderNode[2]);
			node[LayerLeaderNode[1].GetNodeID()].energy-=1;

		}

		else if(3==node[*it].layer())
		{
			node[LayerLeaderNode[3].GetNodeID()].energy-=1+alpha * SDistanceBetweenNodes(LayerLeaderNode[3],LayerLeaderNode[2]);
			node[*it].energy-=0.5+alpha * SDistanceBetweenNodes(node[*it],LayerLeaderNode[3]);
			node[LayerLeaderNode[1].GetNodeID()].energy-=1;
			node[LayerLeaderNode[2].GetNodeID()].energy-=1;
		}
		else 
		{
			node[LayerLeaderNode[4].GetNodeID()].energy-=1+alpha * SDistanceBetweenNodes(LayerLeaderNode[4],LayerLeaderNode[3]);
			node[*it].energy-=0.5+alpha * SDistanceBetweenNodes(node[*it],LayerLeaderNode[4]);
			node[LayerLeaderNode[1].GetNodeID()].energy-=1;
			node[LayerLeaderNode[2].GetNodeID()].energy-=1;
			node[LayerLeaderNode[3].GetNodeID()].energy-=1;
		}

		//不同的能量的节点画不同的颜色
		drawCrossNode(img,node[*it],node[*it].NodeColor());
		imshow("WSN",img);	
	}
	//Leader节点的颜色变化
	for(int i=0;i<NODENUM;i++)
	{
		drawCrossNode(img,node[i],node[i].NodeColor());
		imshow("WSN",img);
	}
	if(true==Test) waitKey(400);   //两次发送的时间间隔
}